

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QMultiHash<QByteArray,_QByteArray> * __thiscall
QMultiHash<QByteArray,_QByteArray>::unite
          (QMultiHash<QByteArray,_QByteArray> *this,QHash<QByteArray,_QByteArray> *other)

{
  long lVar1;
  bool bVar2;
  QMultiHash<QByteArray,_QByteArray> *in_RSI;
  QMultiHash<QByteArray,_QByteArray> *in_RDI;
  long in_FS_OFFSET;
  const_iterator cit;
  QByteArray *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QByteArray,_QByteArray>::cbegin((QHash<QByteArray,_QByteArray> *)in_RDI);
  while( true ) {
    QHash<QByteArray,_QByteArray>::cend((QHash<QByteArray,_QByteArray> *)in_RDI);
    bVar2 = QHash<QByteArray,_QByteArray>::const_iterator::operator!=
                      ((const_iterator *)in_RDI,(const_iterator *)in_stack_ffffffffffffffa0);
    if (!bVar2) break;
    in_stack_ffffffffffffffa0 =
         QHash<QByteArray,_QByteArray>::const_iterator::key((const_iterator *)0x10d5d9);
    QHash<QByteArray,_QByteArray>::const_iterator::operator*((const_iterator *)0x10d5e8);
    insert(in_RSI,(QByteArray *)in_RDI,in_stack_ffffffffffffffa0);
    QHash<QByteArray,_QByteArray>::const_iterator::operator++((const_iterator *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QMultiHash &unite(const QHash<Key, T> &other)
    {
        for (auto cit = other.cbegin(); cit != other.cend(); ++cit)
            insert(cit.key(), *cit);
        return *this;
    }